

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O2

void rr::pa::LineLoop::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
               (__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  VertexPacket *pVVar1;
  size_t sVar2;
  int *piVar3;
  
  if (1 < numVertices) {
    piVar3 = &(outputIterator._M_current)->provokingIndex;
    sVar2 = 1;
    while( true ) {
      if (numVertices == sVar2) break;
      pVVar1 = vertices[sVar2];
      ((Line *)(piVar3 + -4))->v0 = vertices[sVar2 - 1];
      *(VertexPacket **)(piVar3 + -2) = pVVar1;
      *piVar3 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST);
      sVar2 = sVar2 + 1;
      piVar3 = piVar3 + 6;
    }
    pVVar1 = *vertices;
    ((Line *)(piVar3 + -4))->v0 = vertices[sVar2 - 1];
    *(VertexPacket **)(piVar3 + -2) = pVVar1;
    *piVar3 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST);
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 2)
		{
		}
		else
		{
			VertexPacket* prev = vertices[0];

			for (size_t ndx = 1; ndx < numVertices; ++ndx)
			{
				*(outputIterator++) = Line(prev, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (1));
				prev = vertices[ndx];
			}

			*(outputIterator++) = Line(prev, vertices[0], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (1));
		}
	}